

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_file_utils.cpp
# Opt level: O1

bool crnlib::file_utils::does_file_exist(char *pFilename)

{
  int iVar1;
  stat stat_buf;
  stat sStack_98;
  
  iVar1 = stat(pFilename,&sStack_98);
  return (sStack_98.st_mode & 0xf000) == 0x8000 && iVar1 == 0;
}

Assistant:

bool file_utils::does_file_exist(const char* pFilename)
    {
        struct stat stat_buf;
        int result = stat(pFilename, &stat_buf);
        if (result)
        {
            return false;
        }
        if (S_ISREG(stat_buf.st_mode))
        {
            return true;
        }
        return false;
    }